

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O3

void __thiscall
wallet::wallet_tests::coin_mark_dirty_immature_credit::test_method
          (coin_mark_dirty_immature_credit *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  _Atomic_word *p_Var1;
  _Base_ptr *pp_Var2;
  Chain *chain;
  pointer psVar3;
  uint256 *puVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  MockableData records;
  Chainstate *pCVar7;
  char *pcVar8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  long in_FS_OFFSET;
  CTransactionRef tx;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined8 in_stack_fffffffffffff778;
  isminefilter in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff784;
  undefined8 in_stack_fffffffffffff788;
  undefined8 in_stack_fffffffffffff790;
  undefined8 in_stack_fffffffffffff798;
  size_t in_stack_fffffffffffff7a0;
  undefined1 local_854 [12];
  lazy_ostream local_848;
  undefined1 *local_838;
  char *local_830;
  undefined1 *local_828;
  undefined1 *local_820;
  char *local_818;
  char *local_810;
  undefined1 local_808 [16];
  pointer local_7f8;
  pointer local_7f0;
  pointer local_7e8;
  char *local_7e0;
  char *local_7d8;
  assertion_result local_7d0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock40;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock39;
  undefined **local_798;
  ulong uStack_790;
  undefined1 *local_788;
  pointer *ppCStack_780;
  uint local_778;
  undefined4 local_774;
  undefined1 local_770;
  CWalletTx wtx;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_558;
  CWallet wallet;
  undefined **local_58;
  ulong uStack_50;
  undefined1 *local_48;
  pointer *ppCStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  chain = (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
          super_BasicTestingSetup.m_node.chain._M_t.
          super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
          super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
          super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  pp_Var2 = &wtx.mapValue._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  wtx.mapValue._M_t._M_impl._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&wtx,"");
  local_558._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_558._M_impl.super__Rb_tree_header._M_header;
  local_558._M_impl._0_8_ = 0;
  local_558._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_558._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_558._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_558._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_color = in_stack_fffffffffffff780;
  records._M_t._M_impl._0_8_ = in_stack_fffffffffffff778;
  records._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = in_stack_fffffffffffff784;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_fffffffffffff788;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_fffffffffffff790;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)in_stack_fffffffffffff798;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffff7a0;
  local_558._M_impl.super__Rb_tree_header._M_header._M_right =
       local_558._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase((wallet *)&local_7f8,records);
  CWallet::CWallet(&wallet,chain,(string *)&wtx,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&local_7f8);
  if (local_7f8 != (pointer)0x0) {
    (**(code **)(*(long *)(local_7f8->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
                + 8))();
  }
  local_7f8 = (pointer)0x0;
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_558);
  if ((_Base_ptr *)wtx.mapValue._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)wtx.mapValue._M_t._M_impl._0_8_,
                    (ulong)((long)&(wtx.mapValue._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  criticalblock39.super_unique_lock._M_device = &wallet.cs_wallet.super_recursive_mutex;
  criticalblock39.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock39.super_unique_lock);
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  pcVar8 = "m_node.chainman";
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (val,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
             ,0x179,"test_method","m_node.chainman");
  criticalblock40.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock40.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock40.super_unique_lock);
  psVar3 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_808._0_8_ =
       psVar3[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_808._8_8_ =
       psVar3[-1].super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((pointer)local_808._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)
               ((long)(((pointer)local_808._8_8_)->prevout).hash.m_wrapped.super_base_blob<256U>.
                      m_data._M_elems + 8);
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (_Atomic_word *)
               ((long)(((pointer)local_808._8_8_)->prevout).hash.m_wrapped.super_base_blob<256U>.
                      m_data._M_elems + 8);
      *p_Var1 = *p_Var1 + 1;
    }
  }
  pCVar7 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  puVar4 = (pCVar7->m_chain).vChain.
           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->phashBlock;
  if (puVar4 != (uint256 *)0x0) {
    local_58 = *(undefined ***)(puVar4->super_base_blob<256U>).m_data._M_elems;
    uStack_50 = *(ulong *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
    local_48 = *(undefined1 **)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
    ppCStack_40 = *(pointer **)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
    pCVar7 = ChainstateManager::ActiveChainstate
                       ((val->_M_t).
                        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                        .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    local_778 = (int)((ulong)((long)(pCVar7->m_chain).vChain.
                                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pCVar7->m_chain).vChain.
                                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
    local_788 = local_48;
    ppCStack_780 = ppCStack_40;
    local_798 = local_58;
    uStack_790 = uStack_50;
    local_774 = 0;
    local_770 = 0;
    tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_798;
    tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_808;
    CWalletTx::CWalletTx(&wtx,tx,(TxState *)(ulong)local_778);
    if ((pointer)local_808._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_808._8_8_);
    }
    CWallet::SetWalletFlag(&wallet,0x400000000);
    CWallet::SetupDescriptorScriptPubKeyMans(&wallet);
    pCVar7 = ChainstateManager::ActiveChainstate
                       ((val->_M_t).
                        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                        .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar5 = (pCVar7->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppCVar6 = (pCVar7->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar7 = ChainstateManager::ActiveChainstate
                       ((val->_M_t).
                        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                        .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    puVar4 = (pCVar7->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->phashBlock;
    if (puVar4 != (uint256 *)0x0) {
      wallet.m_last_block_processed_height = (int)((ulong)((long)ppCVar5 - (long)ppCVar6) >> 3) + -1
      ;
      wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
      wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
      wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
      wallet.m_last_block_processed.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
      local_818 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_810 = "";
      local_828 = &boost::unit_test::basic_cstring<char_const>::null;
      local_820 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x182;
      file.m_begin = (iterator)&local_818;
      msg.m_end = in_R9;
      msg.m_begin = pcVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_828,msg)
      ;
      local_848.m_empty = false;
      local_848._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
      local_838 = boost::unit_test::lazy_ostream::inst;
      local_830 = "";
      local_854._4_8_ =
           CachedTxGetImmatureCredit(&wallet,&wtx,(isminefilter *)&stack0xfffffffffffff780);
      local_7e8 = (pointer)(local_854 + 4);
      local_7f0 = (pointer)local_854;
      local_854._0_4_ = 0;
      local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_854._4_8_ == 0);
      local_7d0.m_message.px = (element_type *)0x0;
      local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_7e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_7d8 = "";
      ppCStack_780 = &local_7e8;
      uStack_790 = uStack_790 & 0xffffffffffffff00;
      local_798 = &PTR__lazy_ostream_013892a8;
      local_788 = boost::unit_test::lazy_ostream::inst;
      uStack_50 = uStack_50 & 0xffffffffffffff00;
      local_58 = &PTR__lazy_ostream_013890c8;
      local_48 = boost::unit_test::lazy_ostream::inst;
      pvVar9 = (iterator)0x1;
      pvVar10 = (iterator)0x2;
      ppCStack_40 = &local_7f0;
      boost::test_tools::tt_detail::report_assertion
                (&local_7d0,&local_848,1,2,REQUIRE,0xf65251,(size_t)&local_7e0,0x182,
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_798,"0",&local_58);
      boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
      wtx.m_amounts[0].m_cached.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
      wtx.m_amounts[1].m_cached.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
      wtx.m_amounts[2].m_cached.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
      wtx.m_amounts[3].m_cached.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
      wtx.m_is_cache_empty = true;
      wtx.fChangeCached = false;
      AddKey(&wallet,&(this->super_TestChain100Setup).coinbaseKey);
      file_00.m_end = (iterator)0x188;
      file_00.m_begin = &stack0xfffffffffffff798;
      msg_00.m_end = pvVar10;
      msg_00.m_begin = pvVar9;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                 (size_t)&stack0xfffffffffffff788,msg_00);
      local_848.m_empty = false;
      local_848._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
      local_838 = boost::unit_test::lazy_ostream::inst;
      local_830 = "";
      local_854._0_4_ = 2;
      local_854._4_8_ = CachedTxGetImmatureCredit(&wallet,&wtx,(isminefilter *)local_854);
      local_7d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(local_854._4_8_ == 5000000000);
      local_7d0.m_message.px = (element_type *)0x0;
      local_7d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_7e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
      ;
      local_7d8 = "";
      local_7e8 = (pointer)(local_854 + 4);
      uStack_790 = uStack_790 & 0xffffffffffffff00;
      local_798 = &PTR__lazy_ostream_013892a8;
      local_788 = boost::unit_test::lazy_ostream::inst;
      ppCStack_780 = &local_7e8;
      local_7f0 = (pointer)&stack0xfffffffffffff780;
      uStack_50 = uStack_50 & 0xffffffffffffff00;
      local_58 = &PTR__lazy_ostream_013892a8;
      local_48 = boost::unit_test::lazy_ostream::inst;
      ppCStack_40 = &local_7f0;
      boost::test_tools::tt_detail::report_assertion
                (&local_7d0,&local_848,1,2,REQUIRE,0xf65251,(size_t)&local_7e0,0x188,
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_798,"50*COIN",&local_58);
      boost::detail::shared_count::~shared_count(&local_7d0.m_message.pn);
      std::
      _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
      ::~_Rb_tree(&wtx.mempool_conflicts._M_t);
      if (wtx.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (wtx.tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&wtx.vOrderForm);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&wtx);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock40.super_unique_lock);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock39.super_unique_lock);
      CWallet::~CWallet(&wallet);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_FIXTURE_TEST_CASE(coin_mark_dirty_immature_credit, TestChain100Setup)
{
    CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());

    LOCK(wallet.cs_wallet);
    LOCK(Assert(m_node.chainman)->GetMutex());
    CWalletTx wtx{m_coinbase_txns.back(), TxStateConfirmed{m_node.chainman->ActiveChain().Tip()->GetBlockHash(), m_node.chainman->ActiveChain().Height(), /*index=*/0}};
    wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
    wallet.SetupDescriptorScriptPubKeyMans();

    wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());

    // Call GetImmatureCredit() once before adding the key to the wallet to
    // cache the current immature credit amount, which is 0.
    BOOST_CHECK_EQUAL(CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE), 0);

    // Invalidate the cached value, add the key, and make sure a new immature
    // credit amount is calculated.
    wtx.MarkDirty();
    AddKey(wallet, coinbaseKey);
    BOOST_CHECK_EQUAL(CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE), 50*COIN);
}